

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basewindow_x11.cc
# Opt level: O3

void * bgui::anon_unknown_0::eventLoop(void *arg)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ssize_t sVar6;
  XEvent *event_00;
  fd_set fds;
  XEvent event_1;
  XEvent event;
  fd_set local_578;
  XEvent local_4f8;
  XEvent local_438 [5];
  
  iVar1 = *(int *)(*(long *)((long)arg + 8) + 0x10);
  iVar3 = iVar1 + 0x3f;
  if (-1 < iVar1) {
    iVar3 = iVar1;
  }
LAB_00118e46:
  do {
    iVar4 = XPending(*(undefined8 *)((long)arg + 8));
    if ((iVar4 == 0) && (iVar4 = *(int *)((long)arg + 0x50), iVar4 != 0)) {
      local_578.fds_bits[0] = 0;
      local_578.fds_bits[1] = 0;
      local_578.fds_bits[2] = 0;
      local_578.fds_bits[3] = 0;
      local_578.fds_bits[4] = 0;
      local_578.fds_bits[5] = 0;
      local_578.fds_bits[6] = 0;
      local_578.fds_bits[7] = 0;
      local_578.fds_bits[8] = 0;
      local_578.fds_bits[9] = 0;
      local_578.fds_bits[10] = 0;
      local_578.fds_bits[0xb] = 0;
      local_578.fds_bits[0xc] = 0;
      local_578.fds_bits[0xd] = 0;
      local_578.fds_bits[0xe] = 0;
      local_578.fds_bits[0xf] = 0;
      local_578.fds_bits[iVar3 >> 6] = local_578.fds_bits[iVar3 >> 6] | 1L << ((byte)iVar1 & 0x3f);
      iVar5 = iVar4 + 0x3f;
      if (-1 < iVar4) {
        iVar5 = iVar4;
      }
      local_578.fds_bits[iVar5 >> 6] =
           local_578.fds_bits[iVar5 >> 6] | 1L << ((byte)(iVar4 % 0x40) & 0x3f);
      if (iVar4 < iVar1) {
        iVar4 = iVar1;
      }
      select(iVar4 + 1,&local_578,(fd_set *)0x0,(fd_set *)0x0,(timeval *)0x0);
      sVar6 = read(*(int *)((long)arg + 0x50),local_438,0x400);
      if (0 < (int)sVar6) {
        iVar4 = 0;
        do {
          usleep(250000);
          (**(code **)(**arg + 0x30))(*arg,*(undefined4 *)((long)local_438 + (long)iVar4));
          iVar4 = *(int *)((long)local_438 + (long)iVar4 + 0xc) + iVar4 + 0x10;
        } while (iVar4 < (int)sVar6);
      }
      iVar4 = XPending(*(undefined8 *)((long)arg + 8));
      if (iVar4 < 1) goto LAB_00118e46;
      event_00 = &local_4f8;
      XNextEvent(*(undefined8 *)((long)arg + 8),event_00);
    }
    else {
      XNextEvent(*(undefined8 *)((long)arg + 8),local_438);
      event_00 = local_438;
    }
    bVar2 = handleX11Event((BaseWindowData *)arg,event_00);
    if (!bVar2) {
      *(undefined1 *)((long)arg + 0xd0) = 0;
      XUnmapWindow(*(undefined8 *)((long)arg + 8),*(undefined8 *)((long)arg + 0x18));
      XFlush(*(undefined8 *)((long)arg + 8));
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

void *eventLoop(void *arg)
{
  BaseWindowData *p=static_cast<BaseWindowData *>(arg);
  bool run=true;

#ifdef INCLUDE_INOTIFY
  int x11_fd=ConnectionNumber(p->display);
#endif

  while (run)
  {
#ifdef INCLUDE_INOTIFY

    if (XPending(p->display) == 0 && p->inotify_fd != 0)
    {
      // wait for X11 and inotify events at the same time

      fd_set fds;
      const int buflen=1024;
      char buffer[buflen];

      FD_ZERO(&fds);
      FD_SET(x11_fd, &fds);
      FD_SET(p->inotify_fd, &fds);

      select(std::max(x11_fd, p->inotify_fd)+1, &fds, 0, 0, 0);

      // handle inotify events

      int i=0, s=read(p->inotify_fd, buffer, buflen);

      while (i < s)
      {
        struct inotify_event *event=reinterpret_cast<struct inotify_event *>(buffer+i);

        usleep(250000);

        p->parent->onFileChanged(event->wd);

        i+=sizeof(struct inotify_event)+event->len;
      }

      // handle X11 events

      if (XPending(p->display) > 0)
      {
        XEvent event;

        XNextEvent(p->display, &event);
        run=handleX11Event(p, event);
      }
    }
    else
#endif
    {
      // wait for and handle X11 events only

      XEvent event;

      XNextEvent(p->display, &event);
      run=handleX11Event(p, event);
    }
  }

  p->running=false;

  XUnmapWindow(p->display, p->window);
  XFlush(p->display);

  return 0;
}